

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

gnode_t * get_enclosing(gravity_parser_t *parser,gnode_n tag)

{
  lexer_r *plVar1;
  gnode_t *pgVar2;
  lexer_r *plVar3;
  lexer_r *plVar4;
  
  if ((parser == (gravity_parser_t *)0x0) || (plVar1 = parser->lexer, (int)plVar1 == 0)) {
    return (gnode_t *)0x0;
  }
  plVar4 = (lexer_r *)((ulong)plVar1 & 0xffffffff);
  do {
    plVar3 = plVar4 + -1;
    plVar4 = (lexer_r *)((long)&plVar3->p + 7);
    if ((int)plVar4 + 1 < 1) {
      return (gnode_t *)0x0;
    }
    if (plVar1 <= plVar4) {
      return (gnode_t *)0x0;
    }
    pgVar2 = (gnode_t *)(&parser->statements[2].m)[(long)&plVar3->p];
    if (pgVar2 == (gnode_t *)0x0) {
      return (gnode_t *)0x0;
    }
  } while (pgVar2->tag != tag);
  return pgVar2;
}

Assistant:

static gnode_t *get_enclosing (gravity_parser_t *parser, gnode_n tag) {
    int32_t n = (int32_t)gnode_array_size(parser->declarations);
    if (!n) return NULL;

    --n;
    while (n >= 0) {
        gnode_t *decl = gnode_array_get(parser->declarations, n);
        if (!decl) return NULL;
        if (decl->tag == tag) return decl;
        --n;
    }

    return NULL;
}